

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_2fPoint * __thiscall ON_2fPoint::operator=(ON_2fPoint *this,double *p)

{
  double *p_local;
  ON_2fPoint *this_local;
  
  if (p == (double *)0x0) {
    this->y = 0.0;
    this->x = 0.0;
  }
  else {
    this->x = (float)*p;
    this->y = (float)p[1];
  }
  return this;
}

Assistant:

ON_2fPoint& ON_2fPoint::operator=(const double* p)
{
  if ( p ) {
    x = (float)p[0];
    y = (float)p[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}